

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::to_model_mode(Application *this)

{
  Scene *pSVar1;
  Mesh *this_00;
  _Base_ptr p_Var2;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 0) {
    PathTracer::stop(this->pathtracer);
    PathTracer::clear(this->pathtracer);
    pSVar1 = this->scene;
    (pSVar1->selected).coordinates.z = 0.0;
    (pSVar1->selected).coordinates.x = 0.0;
    (pSVar1->selected).coordinates.y = 0.0;
    (pSVar1->selected).object = (SceneObject *)0x0;
    (pSVar1->selected).element = (HalfedgeElement *)0x0;
    (pSVar1->selected).axis = None;
    pSVar1 = this->scene;
    for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (*(long *)(p_Var2 + 1) != 0) {
        this_00 = (Mesh *)__dynamic_cast(*(long *)(p_Var2 + 1),&DynamicScene::SceneObject::typeinfo,
                                         &DynamicScene::Mesh::typeinfo,0);
        if (this_00 != (Mesh *)0x0) {
          DynamicScene::Mesh::resetWave(this_00);
          reset_vertex_positions(this_00,false);
        }
      }
    }
    *(undefined8 *)&(this->super_Renderer).field_0xc = 0;
    setGhosted(this,false);
    return;
  }
  return;
}

Assistant:

void Application::to_model_mode() {
  if (mode == MODEL_MODE) return;
  pathtracer->stop();
  pathtracer->clear();
  scene->selected.clear();

  for (auto o : scene->objects) {
    DynamicScene::Mesh *m = dynamic_cast<DynamicScene::Mesh *>(o);
    if (m != nullptr) {  // Mesh
      m->resetWave();

      reset_vertex_positions(m, false);
    }
  }

  mode = MODEL_MODE;

  action = Action::Navigate;
  setGhosted(false);
}